

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O0

Geometry * __thiscall
Rml::ElementBackgroundBorder::GetClipGeometry
          (ElementBackgroundBorder *this,Element *element,BoxArea clip_area)

{
  code *pcVar1;
  bool bVar2;
  RenderManager *mesh_00;
  undefined1 local_b8 [16];
  ColourbPremultiplied local_a8 [4];
  RenderBox local_98;
  undefined1 local_68 [8];
  Mesh mesh;
  Geometry *geometry;
  RenderManager *render_manager;
  BackgroundType type;
  BoxArea clip_area_local;
  Element *element_local;
  ElementBackgroundBorder *this_local;
  
  if (clip_area == Border) {
    render_manager._0_4_ = ClipBorder;
  }
  else if (clip_area == Padding) {
    render_manager._0_4_ = ClipPadding;
  }
  else {
    if (clip_area != Content) {
      bVar2 = Assert("RMLUI_ERROR",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementBackgroundBorder.cpp"
                     ,0x57);
      if (bVar2) {
        return (Geometry *)0x0;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    render_manager._0_4_ = ClipContent;
  }
  mesh_00 = Element::GetRenderManager(element);
  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)GetOrCreateBackground(this,(BackgroundType)render_manager);
  if ((mesh_00 != (RenderManager *)0x0) &&
     (bVar2 = UniqueRenderResource::operator_cast_to_bool
                        ((UniqueRenderResource *)
                         mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage), !bVar2)) {
    Geometry::Release((Mesh *)local_68,
                      (Geometry *)
                      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,ClearMesh);
    Element::GetRenderBox(&local_98,element,clip_area,0);
    Colour<unsigned_char,_255,_true>::Colour(local_a8,0xff,0xff);
    MeshUtilities::GenerateBackground((Mesh *)local_68,&local_98,local_a8[0]);
    RenderManager::MakeGeometry((RenderManager *)local_b8,(Mesh *)mesh_00);
    Geometry::operator=((Geometry *)
                        mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(Geometry *)local_b8);
    Geometry::~Geometry((Geometry *)local_b8);
    Mesh::~Mesh((Mesh *)local_68);
  }
  return (Geometry *)
         mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
}

Assistant:

Geometry* ElementBackgroundBorder::GetClipGeometry(Element* element, BoxArea clip_area)
{
	BackgroundType type = {};
	switch (clip_area)
	{
	case Rml::BoxArea::Border: type = BackgroundType::ClipBorder; break;
	case Rml::BoxArea::Padding: type = BackgroundType::ClipPadding; break;
	case Rml::BoxArea::Content: type = BackgroundType::ClipContent; break;
	default: RMLUI_ERROR; return nullptr;
	}

	RenderManager* render_manager = element->GetRenderManager();
	Geometry& geometry = GetOrCreateBackground(type).geometry;
	if (render_manager && !geometry)
	{
		Mesh mesh = geometry.Release(Geometry::ReleaseMode::ClearMesh);
		MeshUtilities::GenerateBackground(mesh, element->GetRenderBox(clip_area), ColourbPremultiplied(255));
		geometry = render_manager->MakeGeometry(std::move(mesh));
	}

	return &geometry;
}